

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcursor.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  char local_68 [8];
  SDL_Event event;
  long lStack_48;
  int current;
  SDL_Cursor *cursor [3];
  SDL_bool quit;
  SDL_Surface *screen;
  char **argv_local;
  int argc_local;
  
  bVar1 = false;
  iVar3 = SDL_Init(0x20);
  pFVar2 = _stderr;
  if (iVar3 < 0) {
    uVar4 = SDL_GetError();
    fprintf(pFVar2,"Couldn\'t initialize SDL: %s\n",uVar4);
    argv_local._4_4_ = 1;
  }
  else {
    lVar5 = SDL_SetVideoMode(0x140,200,8,0x10000000);
    pFVar2 = _stderr;
    if (lVar5 == 0) {
      uVar4 = SDL_GetError();
      fprintf(pFVar2,"Couldn\'t initialize video mode: %s\n",uVar4);
      argv_local._4_4_ = 1;
    }
    else {
      SDL_FillRect(lVar5,0,0x664422);
      lStack_48 = SDL_CreateCursor(cursor_data,cursor_mask,0x10,0x10,8);
      pFVar2 = _stderr;
      if (lStack_48 == 0) {
        uVar4 = SDL_GetError();
        fprintf(pFVar2,"Couldn\'t initialize test cursor: %s\n",uVar4);
        SDL_Quit();
        argv_local._4_4_ = 1;
      }
      else {
        cursor[0] = create_arrow_cursor();
        pFVar2 = _stderr;
        if (cursor[0] == (SDL_Cursor *)0x0) {
          uVar4 = SDL_GetError();
          fprintf(pFVar2,"Couldn\'t initialize arrow cursor: %s\n",uVar4);
          SDL_FreeCursor(lStack_48);
          SDL_Quit();
          argv_local._4_4_ = 1;
        }
        else {
          cursor[1] = (SDL_Cursor *)SDL_CreateCursor(small_cursor_data,small_cursor_mask,8,0xb,3,5);
          pFVar2 = _stderr;
          if (cursor[1] == (SDL_Cursor *)0x0) {
            uVar4 = SDL_GetError();
            fprintf(pFVar2,"Couldn\'t initialize test cursor: %s\n",uVar4);
            SDL_Quit();
            argv_local._4_4_ = 1;
          }
          else {
            event._20_4_ = 0;
            SDL_SetCursor(lStack_48);
            while (!bVar1) {
              while (iVar3 = SDL_PollEvent(local_68), iVar3 != 0) {
                if (local_68[0] == '\x02') {
                  if (event.jhat == (SDL_JoyHatEvent)0x1b) {
                    bVar1 = true;
                  }
                }
                else if (local_68[0] == '\x05') {
                  event._20_4_ = (event._20_4_ + 1) % 3;
                  SDL_SetCursor(*(undefined8 *)
                                 ((long)&stack0xffffffffffffffb8 + (long)(int)event._20_4_ * 8));
                }
                else if (local_68[0] == '\f') {
                  bVar1 = true;
                }
              }
              SDL_Flip(lVar5);
              SDL_Delay(1);
            }
            SDL_FreeCursor(lStack_48);
            SDL_FreeCursor(cursor[0]);
            SDL_FreeCursor(cursor[1]);
            SDL_Quit();
            argv_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_bool quit = SDL_FALSE;
	SDL_Cursor *cursor[3];
	int current;

	/* Load the SDL library */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	screen = SDL_SetVideoMode(320,200,8,SDL_ANYFORMAT);
	if (screen==NULL) {
		fprintf(stderr, "Couldn't initialize video mode: %s\n",SDL_GetError());
		return(1);
	}

	SDL_FillRect(screen, NULL, 0x664422);

	cursor[0] = SDL_CreateCursor((Uint8 *)cursor_data, (Uint8 *)cursor_mask,
		16, 16, 8, 8);
	if (cursor[0]==NULL) {
		fprintf(stderr, "Couldn't initialize test cursor: %s\n",SDL_GetError());
		SDL_Quit();
		return(1);
	}
	cursor[1] = create_arrow_cursor();
	if (cursor[1]==NULL) {
		fprintf(stderr, "Couldn't initialize arrow cursor: %s\n",SDL_GetError());
		SDL_FreeCursor(cursor[0]);
		SDL_Quit();
		return(1);
	}
	cursor[2] = SDL_CreateCursor(small_cursor_data, small_cursor_mask,
		8, 11, 3, 5);
	if (cursor[2]==NULL) {
		fprintf(stderr, "Couldn't initialize test cursor: %s\n",SDL_GetError());
		SDL_Quit();
		return(1);
	}

	current = 0;
	SDL_SetCursor(cursor[current]);

	while (!quit) {
		SDL_Event	event;
		while (SDL_PollEvent(&event)) {
			switch(event.type) {
				case SDL_MOUSEBUTTONDOWN:
					current = (current + 1)%3;
					SDL_SetCursor(cursor[current]);
					break;
				case SDL_KEYDOWN:
					if (event.key.keysym.sym == SDLK_ESCAPE) {
						quit = SDL_TRUE;
					}
					break;
				case SDL_QUIT:
					quit = SDL_TRUE;
					break;
			}
		}	
		SDL_Flip(screen);
		SDL_Delay(1);
	}

	SDL_FreeCursor(cursor[0]);
	SDL_FreeCursor(cursor[1]);
	SDL_FreeCursor(cursor[2]);

	SDL_Quit();
	return(0);
}